

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O2

uint8_t * __thiscall
google::protobuf::io::CodedOutputStream::WriteStringWithSizeToArray
          (CodedOutputStream *this,string_view str,uint8_t *target)

{
  Nullable<const_char_*> failure_msg;
  uint8_t *__dest;
  uint local_2c;
  CodedOutputStream *local_28 [2];
  
  local_2c = 0xffffffff;
  local_28[0] = this;
  failure_msg = absl::lts_20250127::log_internal::Check_LEImpl<unsigned_long,unsigned_int>
                          ((unsigned_long *)local_28,&local_2c,
                           "str.size() <= std::numeric_limits<uint32_t>::max()");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    __dest = WriteVarint32ToArray((uint32_t)this,(uint8_t *)str._M_str);
    memcpy(__dest,(void *)str._M_len,(ulong)this & 0xffffffff);
    return __dest + (int)(uint32_t)this;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_28,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.cc"
             ,0x401,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_28);
}

Assistant:

uint8_t* CodedOutputStream::WriteStringWithSizeToArray(absl::string_view str,
                                                       uint8_t* target) {
  ABSL_DCHECK_LE(str.size(), std::numeric_limits<uint32_t>::max());
  target = WriteVarint32ToArray(str.size(), target);
  return WriteStringToArray(str, target);
}